

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

void __thiscall
libmatroska::KaxBlockVirtual::KaxBlockVirtual(KaxBlockVirtual *this,KaxBlockVirtual *ElementToClone)

{
  libebml::EbmlBinary::EbmlBinary(&this->super_EbmlBinary,&ElementToClone->super_EbmlBinary);
  (this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement =
       (_func_int **)&PTR__KaxBlockVirtual_001df520;
  this->Timecode = ElementToClone->Timecode;
  this->TrackNumber = ElementToClone->TrackNumber;
  this->ParentCluster = ElementToClone->ParentCluster;
  (this->super_EbmlBinary).Data = this->DataBlock;
  (this->super_EbmlBinary).super_EbmlElement.Size = 5;
  (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
  return;
}

Assistant:

KaxBlockVirtual::KaxBlockVirtual(const KaxBlockVirtual & ElementToClone)
  :EbmlBinary(ElementToClone)
  ,Timecode(ElementToClone.Timecode)
  ,TrackNumber(ElementToClone.TrackNumber)
  ,ParentCluster(ElementToClone.ParentCluster) ///< \todo not exactly
{
  SetBuffer(DataBlock,sizeof(DataBlock));
  SetValueIsSet(false);
}